

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

void luaK_finish(FuncState *fs)

{
  Proto *pPVar1;
  Instruction *pIVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int dest;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  
  pPVar1 = fs->f;
  uVar7 = 0;
  do {
    if ((long)fs->pc <= (long)uVar7) {
      return;
    }
    pIVar2 = pPVar1->code;
    uVar3 = pIVar2[uVar7];
    uVar5 = uVar3 & 0x7f;
    if (uVar5 - 0x45 < 2) {
LAB_00134807:
      if (fs->needclose != '\0') {
        uVar3 = uVar3 | 0x8000;
        pIVar2[uVar7] = uVar3;
      }
      if (pPVar1->is_vararg != '\0') {
        pIVar2[uVar7] = (uVar3 & 0xffffff) + (uint)pPVar1->numparams * 0x1000000 + 0x1000000;
      }
    }
    else if (uVar5 - 0x47 < 2) {
      if ((fs->needclose != '\0') || (pPVar1->is_vararg != '\0')) {
        uVar3 = uVar3 & 0xffffff80 | 0x46;
        pIVar2[uVar7] = uVar3;
        goto LAB_00134807;
      }
    }
    else if (uVar5 == 0x38) {
      iVar4 = 100;
      uVar6 = uVar7 & 0xffffffff;
      while( true ) {
        bVar8 = iVar4 == 0;
        iVar4 = iVar4 + -1;
        dest = (int)uVar6;
        if ((bVar8) || ((pIVar2[dest] & 0x7f) != 0x38)) break;
        uVar6 = (ulong)((dest + (pIVar2[dest] >> 7)) - 0xfffffe);
      }
      fixjump(fs,(int)uVar7,dest);
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

void luaK_finish (FuncState *fs) {
  int i;
  Proto *p = fs->f;
  for (i = 0; i < fs->pc; i++) {
    Instruction *pc = &p->code[i];
    lua_assert(i == 0 || isOT(*(pc - 1)) == isIT(*pc));
    switch (GET_OPCODE(*pc)) {
      case OP_RETURN0: case OP_RETURN1: {
        if (!(fs->needclose || p->is_vararg))
          break;  /* no extra work */
        /* else use OP_RETURN to do the extra work */
        SET_OPCODE(*pc, OP_RETURN);
      }  /* FALLTHROUGH */
      case OP_RETURN: case OP_TAILCALL: {
        if (fs->needclose)
          SETARG_k(*pc, 1);  /* signal that it needs to close */
        if (p->is_vararg)
          SETARG_C(*pc, p->numparams + 1);  /* signal that it is vararg */
        break;
      }
      case OP_JMP: {
        int target = finaltarget(p->code, i);
        fixjump(fs, i, target);
        break;
      }
      default: break;
    }
  }
}